

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int add_brand(JSParseState *s,ClassFieldsDef *cf)

{
  int iVar1;
  long *in_RSI;
  ClassFieldsDef *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(int *)((long)in_RSI + 0xc) == 0) {
    if ((*in_RSI == 0) &&
       (iVar1 = emit_class_init_start
                          ((JSParseState *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI),
       iVar1 != 0)) {
      return -1;
    }
    *(undefined1 *)(*(long *)(*in_RSI + 0x130) + (long)(int)in_RSI[2]) = 10;
    *(undefined4 *)((long)in_RSI + 0xc) = 1;
  }
  return 0;
}

Assistant:

static __exception int add_brand(JSParseState *s, ClassFieldsDef *cf)
{
    if (!cf->has_brand) {
        /* define the brand field in 'this' of the initializer */
        if (!cf->fields_init_fd) {
            if (emit_class_init_start(s, cf))
                return -1;
        }
        /* patch the start of the function to enable the OP_add_brand code */
        cf->fields_init_fd->byte_code.buf[cf->brand_push_pos] = OP_push_true;
        
        cf->has_brand = TRUE;
    }
    return 0;
}